

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O3

duckdb_state duckdb_query_arrow(duckdb_connection connection,char *query,duckdb_arrow *out_result)

{
  bool bVar1;
  duckdb_arrow this;
  pointer this_00;
  allocator local_51;
  undefined1 local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_38;
  
  this = (duckdb_arrow)operator_new(0x10);
  *(__uniq_ptr_data<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true,_true>
    *)this = (__uniq_ptr_data<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true,_true>
              )0x0;
  *(__uniq_ptr_data<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true,_true>
    *)(this + 8) =
       (__uniq_ptr_data<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true,_true>
        )0x0;
  std::__cxx11::string::string((string *)&local_48,query,&local_51);
  duckdb::Connection::Query((Connection *)local_50,(string *)connection);
  *(undefined1 (*) [8])this = local_50;
  local_50 = (undefined1  [8])0x0;
  if (local_48._M_pi != &local_38) {
    operator_delete(local_48._M_pi);
  }
  *out_result = this;
  this_00 = duckdb::
            unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
            ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                          *)this);
  bVar1 = duckdb::BaseQueryResult::HasError((BaseQueryResult *)this_00);
  return (duckdb_state)bVar1;
}

Assistant:

duckdb_state duckdb_query_arrow(duckdb_connection connection, const char *query, duckdb_arrow *out_result) {
	Connection *conn = (Connection *)connection;
	auto wrapper = new ArrowResultWrapper();
	wrapper->result = conn->Query(query);
	*out_result = (duckdb_arrow)wrapper;
	return !wrapper->result->HasError() ? DuckDBSuccess : DuckDBError;
}